

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

bool __thiscall Tetris::rotation(Tetris *this,int o)

{
  bool bVar1;
  int o_00;
  
  if ((uint)o < 4) {
    o_00 = this->orientation;
    bVar1 = true;
    if (o_00 != o) {
      while ((bVar1 = isValid(this,-1,-1,o_00), o_00 != o && (bVar1))) {
        o_00 = (o_00 + 1) % 4;
      }
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Tetris::rotation(int o)
{
    if (o < 0 || o > 3)
        return false;

    if (orientation == o)
        return true;

    int fromO = orientation;
    while (true) {
        if (!isValid(-1, -1, fromO))
            return false;

        if (fromO == o)
            break;

        fromO = (fromO + 1) % 4;
    }
    return true;
}